

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.c
# Opt level: O3

int establish_server_connection(atom_server as,int do_fallback)

{
  int __fd;
  int iVar1;
  ssize_t sVar2;
  char ping_char;
  int delay_value;
  sockaddr_in sock_addr;
  undefined1 local_29;
  undefined4 local_28;
  int local_24;
  
  local_28 = 1;
  local_29 = 0;
  __fd = as->tcp_fd;
  iVar1 = 0;
  if (__fd != -2) {
    if ((__fd != -1) && (sVar2 = write(__fd,&local_29,1), sVar2 == 1)) {
      return 1;
    }
    establish_server_connection_cold_1();
    iVar1 = local_24;
  }
  return iVar1;
}

Assistant:

static int
establish_server_connection(atom_server as, int do_fallback)
{
    SOCKET sock;
    int delay_value = 1;
    char ping_char = 0;

    if (atom_server_verbose == -1) {
	if (getenv("ATOM_SERVER_VERBOSE") == NULL) {
	    atom_server_verbose = 0;
	} else {
	    atom_server_verbose = 1;
	}
    }
    if (as->tcp_fd == -2) return 0;
    if ((as->tcp_fd == -1) || 
	(write(as->tcp_fd, &ping_char, 1) != 1)) {
	/* reestablish connection, name_str is the machine name */
	struct sockaddr_in sock_addr;

	fprintf(stderr, "Establish server connection, write failed, creating socket\n");
	if ((sock = socket(AF_INET, SOCK_STREAM, 0)) < 0) {
	    fprintf(stderr, "Failed to create socket for ATL atom server connection.  Not enough File Descriptors?\n");
	    return 0;
	}
	
	sock_addr.sin_family = AF_INET;
		
	fprintf(stderr, "Establish server connection, fill_host_addr\n");
	if (fill_hostaddr(&sock_addr.sin_addr, atom_server_host) == 0) {
	    fprintf(stderr, "Unknown Host \"%s\" specified as ATL atom server.\n",
		    atom_server_host);
	    as->tcp_fd = -2;
	    return 0;
	}
	sock_addr.sin_port = htons(TCP_PORT);

	if (atom_server_verbose) {
	    printf("Trying connection to atom server on %s ...  ",
		   atom_server_host);
	}
	if (connect(sock, (struct sockaddr *) &sock_addr,
		    sizeof sock_addr) < 0) {

	    if (atom_server_verbose) {
		printf("failed\n");
	    }
	    if (!do_fallback) return 0;

	    /* fallback */
	    if ((sock = socket(AF_INET, SOCK_STREAM, 0)) < 0) {
		fprintf(stderr, "Failed to create socket for ATL atom server connection.  Not enough File Descriptors?\n");
	       return 0;
	    }
	    atom_server_host = "atomhost.cercs.gatech.edu";
	    sock_addr.sin_family = AF_INET;
	    if (fill_hostaddr(&sock_addr.sin_addr, atom_server_host) == 0){
		fprintf(stderr, "Unknown Host \"%s\" specified as ATL atom server.\n",
			atom_server_host);
		as->tcp_fd = -2;
		return 0;
	    }
	    sock_addr.sin_port = htons(TCP_PORT);
	    if (atom_server_verbose) {
		printf("Trying fallback connection to atom server on %s ...  ",
		       atom_server_host);
	    }
	    if (connect(sock, (struct sockaddr *) &sock_addr,
			sizeof sock_addr) < 0) {
		fprintf(stderr, "Failed to connect to primary or fallback atom servers.\n");
		as->tcp_fd = -2;
	        return 0;
	    }
	}
	if (atom_server_verbose) {
	    printf("succeeded\n");
	}
	setsockopt(sock, IPPROTO_TCP, TCP_NODELAY, (char *) &delay_value,
		   sizeof(delay_value));
	as->tcp_fd = sock;
	/* 
	 * ignore SIGPIPE's  (these pop up when ports die.  we catch the 
	 * failed writes) 
	 */
#ifdef SIGPIPE
	signal(SIGPIPE, SIG_IGN);
#endif
    }
    return 1;
}